

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O2

void deqp::gls::FboUtil::logFramebufferConfig(Framebuffer *cfg,TestLog *log)

{
  _Base_ptr p_Var1;
  GLenum GVar2;
  _Base_ptr p_Var3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  LogSection *in_RCX;
  _Rb_tree_header *__n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  allocator<char> local_ea;
  allocator<char> local_e9;
  Framebuffer *local_e8;
  _Self __tmp;
  string local_d8;
  LogSection local_b8;
  TestLog *local_78;
  string attDesc;
  ScopedLogSection subsection;
  
  local_e8 = cfg;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Framebuffer",(allocator<char> *)&subsection);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&attDesc,"Framebuffer configuration",&local_ea);
  tcu::LogSection::LogSection(&local_b8,&local_d8,&attDesc);
  tcu::LogSection::write(&local_b8,(int)log,__buf,(size_t)in_RCX);
  tcu::LogSection::~LogSection(&local_b8);
  std::__cxx11::string::~string((string *)&attDesc);
  std::__cxx11::string::~string((string *)&local_d8);
  __tmp._M_node = &(local_e8->rbos)._M_t._M_impl.super__Rb_tree_header._M_header;
  for (p_Var3 = (local_e8->rbos)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var3 != __tmp._M_node; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    de::toString<unsigned_int>(&attDesc,&p_Var3[1]._M_color);
    std::operator+(&local_b8.m_name,"Renderbuffer ",&attDesc);
    in_RCX = &local_b8;
    tcu::ScopedLogSection::ScopedLogSection(&subsection,log,&attDesc,&local_b8.m_name);
    std::__cxx11::string::~string((string *)&local_b8);
    p_Var1 = p_Var3[1]._M_parent;
    logImage((Image *)p_Var1,log,false);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Samples",&local_ea);
    de::toString<int>(&local_d8,(int *)&p_Var1->_M_right);
    logField(log,&local_b8.m_name,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    tcu::ScopedLogSection::~ScopedLogSection(&subsection);
    std::__cxx11::string::~string((string *)&attDesc);
  }
  __tmp._M_node = &(local_e8->textures)._M_t._M_impl.super__Rb_tree_header._M_header;
  for (p_Var3 = (local_e8->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var3 != __tmp._M_node; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    de::toString<unsigned_int>(&attDesc,&p_Var3[1]._M_color);
    std::operator+(&local_b8.m_name,"Texture ",&attDesc);
    tcu::ScopedLogSection::ScopedLogSection(&subsection,log,&attDesc,&local_b8.m_name);
    std::__cxx11::string::~string((string *)&local_b8);
    p_Var1 = p_Var3[1]._M_parent;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Type",&local_ea);
    GVar2 = config::glTarget((Image *)p_Var1);
    pcVar4 = glu::getTextureTargetName(GVar2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,pcVar4,&local_e9);
    logField(log,&local_b8.m_name,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    logImage((Image *)p_Var1,log,true);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Levels",&local_ea);
    de::toString<int>(&local_d8,(int *)&p_Var1->_M_right);
    logField(log,&local_b8.m_name,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    in_RCX = (LogSection *)0x0;
    lVar5 = __dynamic_cast(p_Var1,&config::Texture::typeinfo,&config::TextureLayered::typeinfo);
    if (lVar5 != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Layers",&local_ea);
      de::toString<int>(&local_d8,(int *)(lVar5 + 0x1c));
      logField(log,&local_b8.m_name,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    tcu::ScopedLogSection::~ScopedLogSection(&subsection);
    std::__cxx11::string::~string((string *)&attDesc);
  }
  pcVar4 = "Framebuffer attachments";
  if ((local_e8->attachments)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    pcVar4 = "Framebuffer has no attachments";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&attDesc,pcVar4,(allocator<char> *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Attachments",(allocator<char> *)&subsection);
  tcu::LogSection::LogSection(&local_b8,&local_d8,&attDesc);
  tcu::LogSection::write(&local_b8,(int)log,__buf_00,(size_t)in_RCX);
  tcu::LogSection::~LogSection(&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  p_Var3 = (local_e8->attachments)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  __n = &(local_e8->attachments)._M_t._M_impl.super__Rb_tree_header;
  local_e8 = (Framebuffer *)__n;
  local_78 = log;
  do {
    if ((Framebuffer *)p_Var3 == local_e8) {
      tcu::TestLog::endSection(log);
      tcu::TestLog::endSection(log);
      std::__cxx11::string::~string((string *)&attDesc);
      return;
    }
    __tmp._M_node = p_Var3;
    pcVar4 = glu::getFramebufferAttachmentName(p_Var3[1]._M_color);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&subsection,pcVar4,(allocator<char> *)&local_b8);
    std::operator+(&local_d8,"Attachment point ",(string *)&subsection);
    tcu::LogSection::LogSection(&local_b8,(string *)&subsection,&local_d8);
    tcu::LogSection::write(&local_b8,(int)log,__buf_01,(size_t)__n);
    tcu::LogSection::~LogSection(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    p_Var3 = __tmp._M_node[1]._M_parent;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Target",&local_ea);
    pcVar4 = glu::getFramebufferTargetName(*(GLenum *)&p_Var3->_M_parent);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,pcVar4,&local_e9);
    logField(log,&local_b8.m_name,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Type",&local_ea);
    GVar2 = config::attachmentType((Attachment *)p_Var3);
    pcVar4 = glu::getFramebufferAttachmentTypeName(GVar2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,pcVar4,&local_e9);
    logField(log,&local_b8.m_name,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Image Name",&local_ea);
    de::toString<unsigned_int>(&local_d8,(GLuint *)((long)&p_Var3->_M_parent + 4));
    logField(log,&local_b8.m_name,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    __n = (_Rb_tree_header *)0x0;
    lVar5 = __dynamic_cast(p_Var3,&config::Attachment::typeinfo,
                           &config::RenderbufferAttachment::typeinfo);
    if (lVar5 == 0) {
      __n = (_Rb_tree_header *)0x0;
      lVar5 = __dynamic_cast(p_Var3,&config::Attachment::typeinfo,
                             &config::TextureAttachment::typeinfo);
      if (lVar5 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"Mipmap Level",&local_ea);
        de::toString<int>(&local_d8,(int *)(lVar5 + 0x10));
        logField(log,&local_b8.m_name,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_b8);
        __n = (_Rb_tree_header *)0x0;
        lVar6 = __dynamic_cast(lVar5,&config::TextureAttachment::typeinfo,
                               &config::TextureFlatAttachment::typeinfo);
        if (lVar6 == 0) {
          __n = (_Rb_tree_header *)0x0;
          lVar5 = __dynamic_cast(lVar5,&config::TextureAttachment::typeinfo,
                                 &config::TextureLayerAttachment::typeinfo);
          log = local_78;
          if (lVar5 == 0) goto LAB_014af7f9;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Layer",&local_ea);
          de::toString<int>(&local_d8,(int *)(lVar5 + 0x10));
          logField(log,&local_b8.m_name,&local_d8);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"Texture Target",&local_ea);
          pcVar4 = glu::getTextureTargetName(*(int *)(lVar6 + 0x14));
          log = local_78;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,pcVar4,&local_e9);
          logField(log,&local_b8.m_name,&local_d8);
        }
        goto LAB_014af7e9;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"Renderbuffer Target",&local_ea);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"GL_RENDERBUFFER",&local_e9);
      logField(log,&local_b8.m_name,&local_d8);
LAB_014af7e9:
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
LAB_014af7f9:
    tcu::TestLog::endSection(log);
    std::__cxx11::string::~string((string *)&subsection);
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(__tmp._M_node);
  } while( true );
}

Assistant:

void logFramebufferConfig (const Framebuffer& cfg, TestLog& log)
{
	log << TestLog::Section("Framebuffer", "Framebuffer configuration");

	for (RboMap::const_iterator it = cfg.rbos.begin(); it != cfg.rbos.end(); ++it)
	{
		const string				num			= toString(it->first);
		const tcu::ScopedLogSection	subsection	(log, num, "Renderbuffer " + num);

		logRenderbuffer(*it->second, log);
	}

	for (TextureMap::const_iterator it = cfg.textures.begin();
		it != cfg.textures.end(); ++it)
	{
		const string				num			= toString(it->first);
		const tcu::ScopedLogSection	subsection	(log, num, "Texture " + num);

		logTexture(*it->second, log);
	}

	const string attDesc = cfg.attachments.empty()
		? "Framebuffer has no attachments"
		: "Framebuffer attachments";
	log << TestLog::Section("Attachments", attDesc);
	for (AttachmentMap::const_iterator it = cfg.attachments.begin();
		 it != cfg.attachments.end(); it++)
	{
		const string attPointName = getFramebufferAttachmentName(it->first);
		log << TestLog::Section(attPointName, "Attachment point " + attPointName);
		logAttachment(*it->second, log);
		log << TestLog::EndSection;
	}
	log << TestLog::EndSection; // Attachments

	log << TestLog::EndSection; // Framebuffer
}